

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uchar *buf;
  int ret;
  unsigned_long n_len;
  unsigned_long e_len;
  unsigned_long len;
  uchar *n;
  uchar *e;
  uchar *s;
  RSA *rsactx;
  void **abstract_local;
  size_t hostkey_data_len_local;
  uchar *hostkey_data_local;
  LIBSSH2_SESSION *session_local;
  
  rsactx = (RSA *)abstract;
  abstract_local = (void **)hostkey_data_len;
  hostkey_data_len_local = (size_t)hostkey_data;
  hostkey_data_local = (uchar *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_rsa_dtor(session,abstract);
    *(undefined8 *)rsactx = 0;
  }
  sVar1 = hostkey_data_len_local;
  uVar2 = _libssh2_ntohu32((uchar *)hostkey_data_len_local);
  if ((uVar2 == 7) && (iVar3 = strncmp((char *)(sVar1 + 4),"ssh-rsa",7), iVar3 == 0)) {
    uVar2 = _libssh2_ntohu32((uchar *)(sVar1 + 0xb));
    buf = (uchar *)(sVar1 + 0xf) + uVar2;
    uVar4 = _libssh2_ntohu32(buf);
    iVar3 = _libssh2_rsa_new((RSA **)&s,(uchar *)(sVar1 + 0xf),(ulong)uVar2,buf + 4,(ulong)uVar4,
                             (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                             (uchar *)0x0,0,(uchar *)0x0,0);
    if (iVar3 != 0) {
      return -1;
    }
    *(uchar **)rsactx = s;
    return 0;
  }
  return -1;
}

Assistant:

static int
hostkey_method_ssh_rsa_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    const unsigned char *s, *e, *n;
    unsigned long len, e_len, n_len;
    int ret;

    (void) hostkey_data_len;

    if (*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    s = hostkey_data;
    len = _libssh2_ntohu32(s);
    s += 4;

    if (len != 7 || strncmp((char *) s, "ssh-rsa", 7) != 0) {
        return -1;
    }
    s += 7;

    e_len = _libssh2_ntohu32(s);
    s += 4;

    e = s;
    s += e_len;
    n_len = _libssh2_ntohu32(s);
    s += 4;
    n = s;

    ret = _libssh2_rsa_new(&rsactx, e, e_len, n, n_len, NULL, 0,
                           NULL, 0, NULL, 0, NULL, 0, NULL, 0, NULL, 0);
    if (ret) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}